

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

int xmlFileFlush(void *context)

{
  int iVar1;
  int *piVar2;
  FILE *file;
  void *context_local;
  
  if (context == (void *)0x0) {
    context_local._4_4_ = ~XML_ERR_OK;
  }
  else {
    iVar1 = fflush((FILE *)context);
    if (iVar1 == 0) {
      context_local._4_4_ = XML_ERR_OK;
    }
    else {
      piVar2 = __errno_location();
      context_local._4_4_ = xmlIOErr(*piVar2);
    }
  }
  return context_local._4_4_;
}

Assistant:

static int
xmlFileFlush (void * context) {
    FILE *file = context;

    if (file == NULL)
        return(-1);

    if (fflush(file) != 0)
        return(xmlIOErr(errno));

    return(XML_ERR_OK);
}